

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

char * lws_json_simple_find(char *buf,size_t len,char *name,size_t *alen)

{
  size_t nl_00;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int qu;
  char *as;
  char *end;
  char *np;
  size_t nl;
  size_t *alen_local;
  char *name_local;
  size_t len_local;
  char *buf_local;
  
  nl_00 = strlen(name);
  pcVar1 = lws_nstrstr(buf,len,name,nl_00);
  pcVar2 = buf + len;
  if (pcVar1 == (char *)0x0) {
    buf_local = (char *)0x0;
  }
  else {
    end = pcVar1 + nl_00;
    while( true ) {
      bVar3 = false;
      if ((end < pcVar2) && (bVar3 = true, *end != ' ')) {
        bVar3 = *end == '\t';
      }
      if (!bVar3) break;
      end = end + 1;
    }
    if (end < pcVar2) {
      bVar3 = *end == '\"';
      buf_local = end;
      if (bVar3) {
        end = end + 1;
        buf_local = end;
      }
      while( true ) {
        bVar4 = false;
        if ((end < pcVar2) &&
           ((((!bVar3 || (bVar4 = false, *end != '\"')) && (bVar4 = true, !bVar3)) &&
            ((bVar4 = false, *end != '}' && (bVar4 = false, *end != ']')))))) {
          bVar4 = *end != ',';
        }
        if (!bVar4) break;
        if ((bVar3) && (*end == '\\')) {
          end = end + 1;
        }
        end = end + 1;
      }
      *alen = (ulong)(uint)((int)end - (int)buf_local);
    }
    else {
      buf_local = (char *)0x0;
    }
  }
  return buf_local;
}

Assistant:

const char *
lws_json_simple_find(const char *buf, size_t len, const char *name, size_t *alen)
{
	size_t nl = strlen(name);
	const char *np = lws_nstrstr(buf, len, name, nl),
		   *end = buf + len, *as;
	int qu = 0;

	if (!np)
		return NULL;

	np += nl;

	while (np < end && (*np == ' ' || *np == '\t'))
		np++;

	if (np >= end)
		return NULL;

	/*
	 * The arg could be lots of things after "name": with JSON, commonly a
	 * string like "mystring", true, false, null, [...] or {...} ... we want
	 * to handle common, simple cases cheaply with this; the user can choose
	 * a full JSON parser like lejp if it's complicated.  So if no opening
	 * quote, return until a terminator like , ] }.  If there's an opening
	 * quote, return until closing quote, handling escaped quotes.
	 */

	if (*np == '\"') {
		qu = 1;
		np++;
	}

	as = np;
	while (np < end &&
	       (!qu || *np != '\"') && /* end quote is EOT if quoted */
	       (qu || (*np != '}' && *np != ']' && *np != ',')) /* delimiters */
	) {
		if (qu && *np == '\\') /* skip next char if quoted escape */
			np++;
		np++;
	}

	*alen = (unsigned int)lws_ptr_diff(np, as);

	return as;
}